

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  parasail_result_t *ppVar9;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar10;
  uint uVar11;
  __m128i *palVar12;
  ulong uVar13;
  uint uVar14;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  ulong size;
  long lVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i c;
  __m128i c_00;
  uint local_168;
  int local_164;
  size_t len;
  int iVar15;
  longlong extraout_RDX;
  uint uVar44;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse2_128_32_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        uVar8 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_1();
        }
        else {
          uVar18 = uVar8 + 3;
          iVar19 = ppVar3->min;
          uVar11 = 0x80000000 - iVar19;
          if (iVar19 != -open && SBORROW4(iVar19,-open) == iVar19 + open < 0) {
            uVar11 = open | 0x80000000;
          }
          iVar19 = 0x7ffffffe - ppVar3->max;
          ppVar9 = parasail_result_new_table1((uint)uVar18 & 0x7ffffffc,s2Len);
          if (ppVar9 != (parasail_result_t *)0x0) {
            size = uVar18 >> 2;
            ppVar9->flag = ppVar9->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            if (ptr_00 != (__m128i *)0x0 &&
                ((__dest != (__m128i *)0x0 && b_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && b != (__m128i *)0x0))) {
              uVar11 = uVar11 + 1;
              len = (size_t)uVar11;
              uVar21 = (uint)size;
              c[1]._0_4_ = -(gap * uVar21);
              c[0] = size;
              c[1]._4_4_ = 0;
              parasail_memset___m128i(b_00,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = size;
              parasail_memset___m128i(b,c_00,len);
              iVar25 = -open;
              iVar32 = -open;
              iVar33 = -open;
              iVar34 = -open;
              palVar12 = ptr_00 + (uVar21 - 1);
              uVar10 = size;
              do {
                *(int *)*palVar12 = iVar25;
                *(int *)((long)*palVar12 + 4) = iVar32;
                *(int *)(*palVar12 + 1) = iVar33;
                *(int *)((long)*palVar12 + 0xc) = iVar34;
                iVar25 = iVar25 - gap;
                iVar32 = iVar32 - gap;
                iVar33 = iVar33 - gap;
                iVar34 = iVar34 - gap;
                palVar12 = palVar12 + -1;
                iVar15 = (int)uVar10;
                uVar14 = iVar15 - 1;
                uVar10 = (ulong)uVar14;
              } while (uVar14 != 0 && 0 < iVar15);
              palVar12 = b_00 + (uVar21 - 1);
              uVar10 = 1;
              if (1 < s2Len) {
                uVar10 = (ulong)(uint)s2Len;
              }
              lVar20 = (ulong)(uVar21 + (uVar21 == 0)) << 4;
              lVar22 = size * (uint)s2Len;
              lVar24 = 0;
              uVar13 = 0;
              local_164 = 0;
              auVar58._4_4_ = uVar11;
              auVar58._0_4_ = uVar11;
              auVar58._8_4_ = uVar11;
              auVar58._12_4_ = uVar11;
              auVar60._4_4_ = iVar19;
              auVar60._0_4_ = iVar19;
              auVar60._8_4_ = iVar19;
              auVar60._12_4_ = iVar19;
              auVar61 = auVar58;
              auVar42 = auVar58;
              local_168 = uVar11;
              do {
                iVar25 = ppVar3->mapper[(byte)s2[uVar13]];
                lVar16 = 0;
                auVar46._4_4_ = uVar11;
                auVar46._0_4_ = uVar11;
                auVar46._8_4_ = uVar11;
                auVar46._12_4_ = uVar11;
                auVar35 = (undefined1  [16])0x0;
                iVar32 = 0;
                iVar33 = (int)(*palVar12)[0];
                iVar34 = *(int *)((long)*palVar12 + 4);
                iVar15 = (int)(*palVar12)[1];
                do {
                  piVar1 = (int *)((long)*b_00 + lVar16);
                  iVar4 = *piVar1;
                  iVar5 = piVar1[1];
                  iVar6 = piVar1[2];
                  iVar7 = piVar1[3];
                  piVar1 = (int *)((long)*b + lVar16);
                  auVar57._0_4_ = *piVar1 - gap;
                  auVar57._4_4_ = piVar1[1] - gap;
                  auVar57._8_4_ = piVar1[2] - gap;
                  auVar57._12_4_ = piVar1[3] - gap;
                  auVar55._0_4_ = iVar4 - open;
                  auVar55._4_4_ = iVar5 - open;
                  auVar55._8_4_ = iVar6 - open;
                  auVar55._12_4_ = iVar7 - open;
                  auVar56._0_4_ = -(uint)(auVar55._0_4_ < auVar57._0_4_);
                  auVar56._4_4_ = -(uint)(auVar55._4_4_ < auVar57._4_4_);
                  auVar56._8_4_ = -(uint)(auVar55._8_4_ < auVar57._8_4_);
                  auVar56._12_4_ = -(uint)(auVar55._12_4_ < auVar57._12_4_);
                  auVar57 = ~auVar56 & auVar55 | auVar57 & auVar56;
                  piVar1 = (int *)((long)pvVar2 + lVar16 + size * (long)iVar25 * 0x10);
                  auVar26._0_4_ = iVar32 + *piVar1;
                  auVar26._4_4_ = iVar33 + piVar1[1];
                  auVar26._8_4_ = iVar34 + piVar1[2];
                  auVar26._12_4_ = iVar15 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar16);
                  auVar36._0_4_ = auVar35._0_4_ + *piVar1;
                  auVar36._4_4_ = auVar35._4_4_ + piVar1[1];
                  auVar36._8_4_ = auVar35._8_4_ + piVar1[2];
                  auVar36._12_4_ = auVar35._12_4_ + piVar1[3];
                  auVar45._0_4_ = -(uint)(auVar36._0_4_ < auVar46._0_4_);
                  auVar45._4_4_ = -(uint)(auVar36._4_4_ < auVar46._4_4_);
                  auVar45._8_4_ = -(uint)(auVar36._8_4_ < auVar46._8_4_);
                  auVar45._12_4_ = -(uint)(auVar36._12_4_ < auVar46._12_4_);
                  auVar46 = ~auVar45 & auVar36 | auVar46 & auVar45;
                  auVar35._0_4_ = -(uint)(auVar26._0_4_ < auVar57._0_4_);
                  auVar35._4_4_ = -(uint)(auVar26._4_4_ < auVar57._4_4_);
                  auVar35._8_4_ = -(uint)(auVar26._8_4_ < auVar57._8_4_);
                  auVar35._12_4_ = -(uint)(auVar26._12_4_ < auVar57._12_4_);
                  *(undefined1 (*) [16])((long)*b + lVar16) = auVar57;
                  auVar35 = ~auVar35 & auVar26 | auVar57 & auVar35;
                  *(undefined1 (*) [16])((long)*ptr + lVar16) = auVar35;
                  lVar16 = lVar16 + 0x10;
                  iVar32 = iVar4;
                  iVar33 = iVar5;
                  iVar34 = iVar6;
                  iVar15 = iVar7;
                } while (lVar20 != lVar16);
                auVar37._0_8_ = auVar35._0_8_ << 0x20;
                auVar37._8_8_ = auVar35._8_8_ << 0x20 | auVar35._0_8_ >> 0x20;
                iVar25 = (int)(*ptr_00)[0];
                auVar51._4_4_ = *(int *)((long)*ptr_00 + 4) + auVar35._0_4_;
                auVar51._0_4_ = iVar25;
                auVar51._8_4_ = (int)(*ptr_00)[1] + auVar35._4_4_;
                auVar51._12_4_ = *(int *)((long)*ptr_00 + 0xc) + auVar35._8_4_;
                auVar27._0_4_ = -(uint)(iVar25 < auVar46._0_4_);
                auVar27._4_4_ = -(uint)(auVar51._4_4_ < auVar46._4_4_);
                auVar27._8_4_ = -(uint)(auVar51._8_4_ < auVar46._8_4_);
                auVar27._12_4_ = -(uint)(auVar51._12_4_ < auVar46._12_4_);
                auVar46 = ~auVar27 & auVar51 | auVar46 & auVar27;
                iVar25 = 1;
                do {
                  auVar28._4_4_ = auVar46._0_4_ + (int)c[1];
                  auVar28._0_4_ = uVar11;
                  auVar28._8_4_ = auVar46._4_4_ + (int)c[1];
                  auVar28._12_4_ = auVar46._8_4_ + (int)c[1];
                  auVar47._0_4_ = -(uint)((int)uVar11 < auVar46._0_4_);
                  auVar47._4_4_ = -(uint)(auVar28._4_4_ < auVar46._4_4_);
                  auVar47._8_4_ = -(uint)(auVar28._8_4_ < auVar46._8_4_);
                  auVar47._12_4_ = -(uint)(auVar28._12_4_ < auVar46._12_4_);
                  auVar46 = ~auVar47 & auVar28 | auVar46 & auVar47;
                  iVar25 = iVar25 + -1;
                } while (iVar25 == 0);
                auVar30._4_4_ = auVar46._0_4_;
                auVar30._0_4_ = uVar11;
                auVar30._8_4_ = auVar46._4_4_;
                auVar30._12_4_ = auVar46._8_4_;
                auVar48._0_4_ = -(uint)((int)uVar11 < 0);
                auVar48._4_4_ = -(uint)(auVar30._4_4_ < auVar35._0_4_);
                auVar48._8_4_ = -(uint)(auVar30._8_4_ < auVar35._4_4_);
                auVar48._12_4_ = -(uint)(auVar30._12_4_ < auVar35._8_4_);
                auVar46 = ~auVar48 & auVar30 | auVar37 & auVar48;
                auVar38._0_4_ = -(uint)(0 < auVar46._0_4_);
                auVar38._4_4_ = -(uint)(0 < auVar46._4_4_);
                auVar38._8_4_ = -(uint)(0 < auVar46._8_4_);
                auVar38._12_4_ = -(uint)(0 < auVar46._12_4_);
                auVar38 = auVar38 & auVar46;
                lVar17 = 0;
                lVar16 = lVar24;
                do {
                  auVar46 = *(undefined1 (*) [16])((long)*ptr + lVar17);
                  auVar29._0_4_ = auVar30._0_4_ - gap;
                  auVar29._4_4_ = auVar30._4_4_ - gap;
                  auVar29._8_4_ = auVar30._8_4_ - gap;
                  auVar29._12_4_ = auVar30._12_4_ - gap;
                  auVar39._0_4_ = auVar38._0_4_ - open;
                  auVar39._4_4_ = auVar38._4_4_ - open;
                  auVar39._8_4_ = auVar38._8_4_ - open;
                  auVar39._12_4_ = auVar38._12_4_ - open;
                  auVar52._0_4_ = -(uint)(auVar39._0_4_ < auVar29._0_4_);
                  auVar52._4_4_ = -(uint)(auVar39._4_4_ < auVar29._4_4_);
                  auVar52._8_4_ = -(uint)(auVar39._8_4_ < auVar29._8_4_);
                  auVar52._12_4_ = -(uint)(auVar39._12_4_ < auVar29._12_4_);
                  auVar30 = auVar29 & auVar52 | ~auVar52 & auVar39;
                  auVar53._0_4_ = -(uint)(auVar30._0_4_ < auVar46._0_4_);
                  auVar53._4_4_ = -(uint)(auVar30._4_4_ < auVar46._4_4_);
                  auVar53._8_4_ = -(uint)(auVar30._8_4_ < auVar46._8_4_);
                  auVar53._12_4_ = -(uint)(auVar30._12_4_ < auVar46._12_4_);
                  auVar38 = ~auVar53 & auVar30 | auVar46 & auVar53;
                  auVar40._0_4_ = -(uint)(0 < auVar38._0_4_);
                  auVar40._4_4_ = -(uint)(0 < auVar38._4_4_);
                  auVar40._8_4_ = -(uint)(0 < auVar38._8_4_);
                  auVar40._12_4_ = -(uint)(0 < auVar38._12_4_);
                  auVar38 = auVar40 & auVar38;
                  *(undefined1 (*) [16])((long)*b_00 + lVar17) = auVar38;
                  iVar25 = auVar38._0_4_;
                  auVar49._0_4_ = -(uint)(iVar25 < auVar60._0_4_);
                  iVar32 = auVar38._4_4_;
                  auVar49._4_4_ = -(uint)(iVar32 < auVar60._4_4_);
                  iVar33 = auVar38._8_4_;
                  auVar49._8_4_ = -(uint)(iVar33 < auVar60._8_4_);
                  iVar34 = auVar38._12_4_;
                  auVar49._12_4_ = -(uint)(iVar34 < auVar60._12_4_);
                  auVar60 = ~auVar49 & auVar60 | auVar38 & auVar49;
                  auVar54._0_4_ = -(uint)(iVar25 < auVar58._0_4_);
                  auVar54._4_4_ = -(uint)(iVar32 < auVar58._4_4_);
                  auVar54._8_4_ = -(uint)(iVar33 < auVar58._8_4_);
                  auVar54._12_4_ = -(uint)(iVar34 < auVar58._12_4_);
                  auVar58 = ~auVar54 & auVar38 | auVar58 & auVar54;
                  piVar1 = ((ppVar9->field_4).rowcols)->score_row;
                  *(int *)((long)piVar1 + lVar16) = iVar25;
                  *(int *)((long)piVar1 + lVar22 * 4 + lVar16) = iVar32;
                  *(int *)((long)piVar1 + lVar22 * 8 + lVar16) = iVar33;
                  *(int *)((long)piVar1 + lVar22 * 0xc + lVar16) = iVar34;
                  auVar50._0_4_ = -(uint)(auVar61._0_4_ < iVar25);
                  auVar50._4_4_ = -(uint)(auVar61._4_4_ < iVar32);
                  auVar50._8_4_ = -(uint)(auVar61._8_4_ < iVar33);
                  auVar50._12_4_ = -(uint)(auVar61._12_4_ < iVar34);
                  auVar61 = ~auVar50 & auVar61 | auVar38 & auVar50;
                  lVar17 = lVar17 + 0x10;
                  lVar16 = lVar16 + (ulong)(uint)s2Len * 4;
                } while (lVar20 != lVar17);
                auVar31._0_4_ = -(uint)(auVar42._0_4_ < auVar61._0_4_);
                auVar31._4_4_ = -(uint)(auVar42._4_4_ < auVar61._4_4_);
                iVar32 = auVar61._8_4_;
                iVar33 = auVar61._12_4_;
                auVar31._8_4_ = -(uint)(auVar42._8_4_ < iVar32);
                auVar31._12_4_ = -(uint)(auVar42._12_4_ < iVar33);
                iVar25 = movmskps((int)lVar16,auVar31);
                if (iVar25 != 0) {
                  auVar41._0_4_ = -(uint)(iVar32 < auVar61._0_4_);
                  auVar41._4_4_ = -(uint)(iVar33 < auVar61._4_4_);
                  auVar41._8_4_ = -(uint)(0 < iVar32);
                  auVar41._12_4_ = -(uint)(0 < iVar33);
                  auVar42 = ~auVar41 & auVar61 >> 0x40 | auVar61 & auVar41;
                  uVar14 = auVar42._4_4_;
                  uVar44 = auVar42._0_4_;
                  uVar43 = -(uint)((int)uVar14 < (int)uVar44);
                  local_168 = ~uVar43 & uVar14 | uVar44 & uVar43;
                  memcpy(__dest,b_00,size << 4);
                  auVar42._4_4_ = local_168;
                  auVar42._0_4_ = local_168;
                  auVar42._8_4_ = local_168;
                  auVar42._12_4_ = local_168;
                  local_164 = (int)uVar13;
                }
                uVar13 = uVar13 + 1;
                lVar24 = lVar24 + 4;
              } while (uVar13 != uVar10);
              if ((uVar18 & 0x7ffffffc) != 0) {
                uVar14 = (uVar21 & 0x1fffffff) << 2;
                uVar13 = (ulong)uVar14;
                uVar18 = 0;
                do {
                  if ((*(uint *)((long)*__dest + uVar18 * 4) == local_168) &&
                     (uVar23 = ((uint)uVar18 & 3) * uVar21 + ((uint)(uVar18 >> 2) & 0x3fffffff),
                     (int)uVar23 < (int)uVar8)) {
                    uVar8 = (ulong)uVar23;
                  }
                  uVar23 = (uint)uVar8;
                  uVar18 = uVar18 + 1;
                } while (uVar14 != (uint)uVar18);
              }
              auVar61._0_4_ = -(uint)(auVar60._0_4_ < (int)uVar11);
              auVar61._4_4_ = -(uint)(auVar60._4_4_ < (int)uVar11);
              auVar61._8_4_ = -(uint)(auVar60._8_4_ < (int)uVar11);
              auVar61._12_4_ = -(uint)(auVar60._12_4_ < (int)uVar11);
              auVar59._0_4_ = -(uint)(iVar19 < auVar58._0_4_);
              auVar59._4_4_ = -(uint)(iVar19 < auVar58._4_4_);
              auVar59._8_4_ = -(uint)(iVar19 < auVar58._8_4_);
              auVar59._12_4_ = -(uint)(iVar19 < auVar58._12_4_);
              iVar19 = movmskps((int)uVar13,auVar59 | auVar61);
              if (iVar19 != 0) {
                *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                local_168 = 0;
                local_164 = 0;
                uVar23 = 0;
              }
              ppVar9->score = local_168;
              ppVar9->end_query = uVar23;
              ppVar9->end_ref = local_164;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar9;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32_rpl(vHt, vF);
        vH = _mm_max_epi32_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32_rpl(vHt, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}